

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void add_bit_field(c2m_ctx_t c2m_ctx,uint64_t *u,uint64_t v,decl_t member_decl)

{
  byte bVar1;
  sbyte sVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(byte)member_decl->bit_offset;
  bVar1 = (byte)member_decl->width;
  raw_type_size(c2m_ctx,(member_decl->decl_spec).type);
  sVar2 = (bVar1 < 0x41) * ('@' - bVar1);
  *u = *u & ~(((ulong)(-1L << sVar2) >> sVar2) << (uVar5 & 0x3f));
  iVar3 = signed_integer_type_p((member_decl->decl_spec).type);
  uVar4 = (long)(v << ((ulong)(byte)-bVar1 & 0x3f)) >> ((ulong)(byte)-bVar1 & 0x3f);
  if (iVar3 == 0) {
    uVar4 = v;
  }
  sVar2 = (bVar1 < 0x41) * ('@' - bVar1);
  *u = *u | ((uVar4 << sVar2) >> sVar2) << (uVar5 & 0x3f);
  return;
}

Assistant:

static void add_bit_field (c2m_ctx_t c2m_ctx, uint64_t *u, uint64_t v, decl_t member_decl) {
  uint64_t mask, mask2;
  int bit_offset = member_decl->bit_offset, width = member_decl->width;
  size_t MIR_UNUSED size = type_size (c2m_ctx, member_decl->decl_spec.type) * MIR_CHAR_BIT;

  mask = 0xffffffffffffffff >> (64 - width);
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  mask2 = ~(mask << bit_offset);
#else
  mask2 = ~(mask << (size - bit_offset - width));
#endif
  *u &= mask2;
  if (signed_integer_type_p (member_decl->decl_spec.type)) {
    v <<= (64 - width);
    v = (int64_t) v >> (64 - width);
  }
  v &= mask;
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  v <<= bit_offset;
#else
  v <<= size - bit_offset - width;
#endif
  *u |= v;
}